

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleDropEvent(QWidgetWindow *this,QDropEvent *event)

{
  bool bVar1;
  QFlagsStorage<Qt::DropAction> QVar2;
  QFlagsStorage<Qt::MouseButton> QVar3;
  KeyboardModifiers KVar4;
  QWidget *pQVar5;
  QWidget *pos;
  QMimeData *pQVar6;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  QWidget *dragTarget;
  QDropEvent translated;
  QPoint mapped;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  QMessageLogger *in_stack_ffffffffffffff00;
  QDebug *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 local_b0 [16];
  QDropEvent local_a0 [8];
  QWidget *in_stack_ffffffffffffff68;
  QDebug *in_stack_ffffffffffffff70;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x3b65a9);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QMessageLogger::warning();
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b65ef);
    ::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QDebug::operator<<(in_stack_ffffffffffffff08,
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QDebug::~QDebug(&local_10);
    QDebug::~QDebug(&local_18);
    QEvent::ignore(in_RSI);
  }
  else {
    pQVar5 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6661);
    pos = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6674);
    QDropEvent::position((QDropEvent *)pos);
    QPointF::toPoint((QPointF *)pQVar5);
    QWidget::mapToGlobal(pQVar5,(QPoint *)pos);
    QWidget::mapFromGlobal(pQVar5,(QPoint *)pos);
    memcpy(local_a0,&DAT_00aa4be8,0x40);
    QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QVar2.i = (Int)QDropEvent::possibleActions
                             ((QDropEvent *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    pQVar6 = QDropEvent::mimeData((QDropEvent *)in_RSI);
    QVar3.i = (Int)QDropEvent::buttons((QDropEvent *)
                                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                      );
    KVar4 = QDropEvent::modifiers
                      ((QDropEvent *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    uVar7 = 0x3f;
    QDropEvent::QDropEvent
              (local_a0,(QPointF *)local_b0,(QFlags_conflict1 *)(ulong)QVar2.i,pQVar6,
               (QFlags_conflict1 *)(ulong)QVar3.i,
               (QFlags_conflict1 *)
               (ulong)(uint)KVar4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i,Drop);
    pQVar5 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b6776);
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QWidget *)CONCAT44(in_stack_fffffffffffffeec,uVar7));
    QCoreApplication::forwardEvent(&pQVar5->super_QObject,(QEvent *)local_a0,in_RSI);
    bVar1 = QEvent::isAccepted((QEvent *)local_a0);
    (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
    QDropEvent::dropAction(local_a0);
    QDropEvent::setDropAction((DropAction)in_RSI);
    QDropEvent::~QDropEvent(local_a0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleDropEvent(QDropEvent *event)
{
    if (Q_UNLIKELY(m_dragTarget.isNull())) {
        qWarning() << m_widget << ": No drag target set.";
        event->ignore();
        return;
    }
    const QPoint mapped = m_dragTarget->mapFromGlobal(m_widget->mapToGlobal(event->position().toPoint()));
    QDropEvent translated(mapped, event->possibleActions(), event->mimeData(), event->buttons(), event->modifiers());
    QWidget *dragTarget = m_dragTarget;
    m_dragTarget = nullptr;
    QGuiApplication::forwardEvent(dragTarget, &translated, event);
    event->setAccepted(translated.isAccepted());
    event->setDropAction(translated.dropAction());
}